

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntRemove(Vec_Int_t *p,int Entry)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = p->nSize;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  for (lVar2 = 1; lVar2 - uVar4 != 1; lVar2 = lVar2 + 1) {
    piVar1 = p->pArray;
    if (piVar1[lVar2 + -1] == Entry) {
      for (; (int)lVar2 < (int)uVar3; lVar2 = lVar2 + 1) {
        piVar1[lVar2 + -1] = piVar1[lVar2];
        uVar3 = p->nSize;
      }
      p->nSize = uVar3 - 1;
      return 1;
    }
  }
  if (-1 < (int)uVar3) {
    return 0;
  }
  __assert_fail("i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
}

Assistant:

static inline int Vec_IntRemove( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    if ( i == p->nSize )
        return 0;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
    return 1;
}